

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roda.h
# Opt level: O0

void __thiscall Roda::Roda(Roda *this)

{
  Point<double> local_560;
  Point<double> local_548;
  Point<double> local_530;
  Point<double> local_518;
  Point<double> local_500;
  Point<double> local_4e8;
  Point<double> local_4d0;
  Point<double> local_4b8;
  Point<double> local_4a0;
  Point<double> local_488;
  Point<double> local_470;
  Point<double> local_458;
  Point<double> local_440;
  Point<double> local_428;
  Point<double> local_410;
  Point<double> local_3f8;
  Point<double> local_3e0;
  Point<double> local_3c8;
  Point<double> local_3b0;
  Point<double> local_398;
  Point<double> local_380;
  Point<double> local_368;
  Point<double> local_350;
  Point<double> local_338;
  Point<double> local_320;
  Point<double> local_308;
  Point<double> local_2f0;
  Point<double> local_2d8;
  Point<double> local_2c0;
  Point<double> local_2a8;
  Point<double> local_290;
  Point<double> local_278;
  Point<double> local_260;
  Point<double> local_248;
  Point<double> local_230;
  Point<double> local_218;
  Point<double> local_200;
  Point<double> local_1e8;
  Point<double> local_1d0;
  Point<double> local_1b8;
  Point<double> local_1a0;
  Point<double> local_188;
  Point<double> local_170;
  Point<double> local_158;
  Point<double> local_140;
  Point<double> local_128;
  Point<double> local_110;
  Point<double> local_f8;
  Point<double> local_e0;
  Point<double> local_c8;
  Point<double> local_b0;
  Point<double> local_98;
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  Roda *local_10;
  Roda *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,325.0,90.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_50,475.0,90.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_68,475.0,120.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_80,535.0,120.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_98,535.0,150.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_b0,565.0,150.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_c8,565.0,180.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_e0,595.0,180.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_f8,595.0,210.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_110,625.0,210.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_128,625.0,270.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_140,655.0,270.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_158,655.0,420.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_170,625.0,420.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_188,625.0,480.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1a0,595.0,480.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1b8,595.0,510.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1d0,565.0,510.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1e8,565.0,540.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_200,535.0,540.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_218,535.0,570.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_230,475.0,570.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_248,475.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_260,325.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_278,325.0,570.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_290,265.0,570.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2a8,265.0,540.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2c0,235.0,540.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2d8,235.0,510.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_2f0,205.0,510.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_308,205.0,480.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_320,175.0,480.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_338,175.0,420.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_350,145.0,420.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_368,145.0,270.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_380,175.0,270.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_398,175.0,210.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3b0,205.0,210.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3c8,205.0,180.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3e0,235.0,180.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_3f8,235.0,150.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_410,265.0,150.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_428,265.0,120.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_440,325.0,120.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_458,325.0,390.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_470,355.0,390.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_488,355.0,420.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4a0,445.0,420.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4b8,445.0,390.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4d0,475.0,390.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_4e8,475.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_500,445.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_518,445.0,270.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_530,355.0,270.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_548,355.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_560,325.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Roda() {
    addPoint(Point<double>(325,90));
    addPoint(Point<double>(475,90));
    addPoint(Point<double>(475,120));
    addPoint(Point<double>(535,120));
    addPoint(Point<double>(535,150));
    addPoint(Point<double>(565,150));
    addPoint(Point<double>(565,180));
    addPoint(Point<double>(595,180));
    addPoint(Point<double>(595,210));
    addPoint(Point<double>(625,210));
    addPoint(Point<double>(625,270));
    addPoint(Point<double>(655,270));
    addPoint(Point<double>(655,420));
    addPoint(Point<double>(625,420));
    addPoint(Point<double>(625,480));
    addPoint(Point<double>(595,480));
    addPoint(Point<double>(595,510));
    addPoint(Point<double>(565,510));
    addPoint(Point<double>(565,540));
    addPoint(Point<double>(535,540));
    addPoint(Point<double>(535,570));
    addPoint(Point<double>(475,570));
    addPoint(Point<double>(475,600));
    addPoint(Point<double>(325,600));
    addPoint(Point<double>(325,570));
    addPoint(Point<double>(265,570));
    addPoint(Point<double>(265,540));
    addPoint(Point<double>(235,540));
    addPoint(Point<double>(235,510));
    addPoint(Point<double>(205,510));
    addPoint(Point<double>(205,480));
    addPoint(Point<double>(175,480));
    addPoint(Point<double>(175,420));
    addPoint(Point<double>(145,420));
    addPoint(Point<double>(145,270));
    addPoint(Point<double>(175,270));
    addPoint(Point<double>(175,210));
    addPoint(Point<double>(205,210));
    addPoint(Point<double>(205,180));
    addPoint(Point<double>(235,180));
    addPoint(Point<double>(235,150));
    addPoint(Point<double>(265,150));
    addPoint(Point<double>(265,120));
    addPoint(Point<double>(325,120));
    addPoint(Point<double>(325,390));
    addPoint(Point<double>(355,390));
    addPoint(Point<double>(355,420));
    addPoint(Point<double>(445,420));
    addPoint(Point<double>(445,390));
    addPoint(Point<double>(475,390));
    addPoint(Point<double>(475,300));
    addPoint(Point<double>(445,300));
    addPoint(Point<double>(445,270));
    addPoint(Point<double>(355,270));
    addPoint(Point<double>(355,300));
    addPoint(Point<double>(325,300));
  }